

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> __thiscall
kj::anon_unknown_35::InMemoryDirectory::Impl::openEntry(Impl *this,StringPtr name,WriteMode mode)

{
  undefined4 in_register_0000000c;
  StringPtr value;
  String local_48;
  WriteMode local_2c;
  Impl *pIStack_28;
  WriteMode mode_local;
  Impl *this_local;
  StringPtr name_local;
  
  value.content.size_._4_4_ = in_register_0000000c;
  value.content.size_._0_4_ = mode;
  value.content.ptr = (char *)name.content.size_;
  this_local = (Impl *)name.content.ptr;
  local_2c = mode;
  pIStack_28 = this;
  name_local.content.ptr = value.content.ptr;
  heapString(&local_48,(kj *)this_local,value);
  name_local.content.size_ = (size_t)openEntry(this,&local_48,local_2c);
  String::~String(&local_48);
  return (Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>)
         (EntryImpl *)name_local.content.size_;
}

Assistant:

Maybe<EntryImpl&> openEntry(kj::StringPtr name, WriteMode mode) {
      // TODO(perf): We could avoid a copy if the entry exists, at the expense of a double-lookup
      //   if it doesn't. Maybe a better map implementation will solve everything?
      return openEntry(heapString(name), mode);
    }